

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void __thiscall MercuryJson::JSON::JSON(JSON *this,char *document,size_t size,bool manual_construct)

{
  unsigned_long *puVar1;
  byte in_CL;
  size_t in_RDX;
  BlockAllocator<MercuryJson::JsonValue> *in_RSI;
  undefined8 *in_RDI;
  JSON *in_stack_00000078;
  JSON *in_stack_00000080;
  size_t in_stack_ffffffffffffffc8;
  
  BlockAllocator<MercuryJson::JsonValue>::BlockAllocator(in_RSI,in_RDX);
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[0xc] = 0;
  puVar1 = aligned_malloc<unsigned_long>(in_stack_ffffffffffffffc8,(size_t)in_RDI);
  in_RDI[3] = puVar1;
  in_RDI[4] = puVar1;
  in_RDI[2] = 0;
  if ((in_CL & 1) == 0) {
    exec_stage1(in_stack_00000078);
    exec_stage2(in_stack_00000080);
  }
  return;
}

Assistant:

JSON::JSON(char *document, size_t size, bool manual_construct) : allocator(size) {
        input = document;
        input_len = size;
        this->document = nullptr;

        idx_ptr = indices = aligned_malloc<size_t>(size);
        num_indices = 0;
#if ALLOC_PARSED_STR
        literals = static_cast<char *>(aligned_malloc(size));
#endif

        if (!manual_construct) {
            exec_stage1();
            exec_stage2();
        }
    }